

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataGroup.cpp
# Opt level: O2

bool __thiscall DL::DataGroup::isAllOfType(DataGroup *this,DataType type)

{
  element_type *peVar1;
  bool bVar2;
  pointer pDVar3;
  pointer pDVar4;
  
  peVar1 = (this->mShared).super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->AnonymousData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
      super__Vector_impl_data._M_start ==
      *(pointer *)
       ((long)&(peVar1->AnonymousData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>.
               _M_impl.super__Vector_impl_data + 8)) {
    pDVar3 = (peVar1->NamedData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
             super__Vector_impl_data._M_start;
    pDVar4 = *(pointer *)
              ((long)&(peVar1->NamedData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>.
                      _M_impl.super__Vector_impl_data + 8);
    if (pDVar3 == pDVar4) {
      return false;
    }
  }
  else {
    bVar2 = isAllAnonymousOfType(this,type);
    if (!bVar2) {
      return false;
    }
    peVar1 = (this->mShared).super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    pDVar3 = (peVar1->NamedData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
             super__Vector_impl_data._M_start;
    pDVar4 = *(pointer *)
              ((long)&(peVar1->NamedData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>.
                      _M_impl.super__Vector_impl_data + 8);
  }
  if (pDVar3 != pDVar4) {
    bVar2 = isAllNamedOfType(this,type);
    return bVar2;
  }
  return true;
}

Assistant:

bool DataGroup::isAllOfType(DL::DataType type) const
{
	if (mShared->AnonymousData.empty() && mShared->NamedData.empty())
		return false;

	return (mShared->AnonymousData.empty() || isAllAnonymousOfType(type))
		   && (mShared->NamedData.empty() || isAllNamedOfType(type));
}